

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mct.c
# Opt level: O0

void opj_mct_encode_real(OPJ_INT32 *c0,OPJ_INT32 *c1,OPJ_INT32 *c2,OPJ_SIZE_T n)

{
  OPJ_INT32 OVar1;
  OPJ_INT32 OVar2;
  OPJ_INT32 OVar3;
  OPJ_INT32 OVar4;
  OPJ_INT32 OVar5;
  OPJ_INT32 OVar6;
  OPJ_INT32 OVar7;
  OPJ_INT32 OVar8;
  OPJ_INT32 OVar9;
  OPJ_INT32 v;
  OPJ_INT32 u;
  OPJ_INT32 y;
  OPJ_INT32 b;
  OPJ_INT32 g;
  OPJ_INT32 r;
  OPJ_SIZE_T i;
  OPJ_SIZE_T n_local;
  OPJ_INT32 *c2_local;
  OPJ_INT32 *c1_local;
  OPJ_INT32 *c0_local;
  
  for (_g = 0; _g < n; _g = _g + 1) {
    OVar7 = c0[_g];
    OVar8 = c1[_g];
    OVar9 = c2[_g];
    OVar1 = opj_int_fix_mul(OVar7,0x991);
    OVar2 = opj_int_fix_mul(OVar8,0x12c9);
    OVar3 = opj_int_fix_mul(OVar9,0x3a6);
    OVar4 = opj_int_fix_mul(OVar7,0x566);
    OVar5 = opj_int_fix_mul(OVar8,0xa9a);
    OVar6 = opj_int_fix_mul(OVar9,0x1000);
    OVar7 = opj_int_fix_mul(OVar7,0x1000);
    OVar8 = opj_int_fix_mul(OVar8,0xd66);
    OVar9 = opj_int_fix_mul(OVar9,0x29a);
    c0[_g] = OVar1 + OVar2 + OVar3;
    c1[_g] = (-OVar5 - OVar4) + OVar6;
    c2[_g] = (OVar7 - OVar8) - OVar9;
  }
  return;
}

Assistant:

void opj_mct_encode_real(
    OPJ_INT32* OPJ_RESTRICT c0,
    OPJ_INT32* OPJ_RESTRICT c1,
    OPJ_INT32* OPJ_RESTRICT c2,
    OPJ_SIZE_T n)
{
    OPJ_SIZE_T i;
    for (i = 0; i < n; ++i) {
        OPJ_INT32 r = c0[i];
        OPJ_INT32 g = c1[i];
        OPJ_INT32 b = c2[i];
        OPJ_INT32 y =  opj_int_fix_mul(r, 2449) + opj_int_fix_mul(g,
                       4809) + opj_int_fix_mul(b, 934);
        OPJ_INT32 u = -opj_int_fix_mul(r, 1382) - opj_int_fix_mul(g,
                      2714) + opj_int_fix_mul(b, 4096);
        OPJ_INT32 v =  opj_int_fix_mul(r, 4096) - opj_int_fix_mul(g,
                       3430) - opj_int_fix_mul(b, 666);
        c0[i] = y;
        c1[i] = u;
        c2[i] = v;
    }
}